

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O0

StructDeclarationSymbol * __thiscall
psy::C::SemanticModel::structFor(SemanticModel *this,StructOrUnionDeclarationSyntax *node)

{
  SymbolKind SVar1;
  SyntaxKind SVar2;
  int iVar3;
  Symbol *this_00;
  ostream *poVar4;
  undefined4 extraout_var;
  TypeDeclarationSymbol *tyDecl;
  StructOrUnionDeclarationSyntax *node_local;
  SemanticModel *this_local;
  
  SVar2 = C::SyntaxNode::kind((SyntaxNode *)node);
  if (SVar2 == StructDeclaration) {
    this_00 = (Symbol *)typeDeclarationFor(this,(TypeDeclarationSyntax *)node);
    SVar1 = Symbol::kind(this_00);
    if (SVar1 == StructDeclaration) {
      iVar3 = (*this_00->_vptr_Symbol[0x1f])();
      this_local = (SemanticModel *)CONCAT44(extraout_var,iVar3);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc4);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,"<empty message>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local = (SemanticModel *)0x0;
    }
  }
  else {
    this_local = (SemanticModel *)0x0;
  }
  return (StructDeclarationSymbol *)this_local;
}

Assistant:

const StructDeclarationSymbol* SemanticModel::structFor(
        const StructOrUnionDeclarationSyntax* node) const
{
    if (node->kind() != SyntaxKind::StructDeclaration)
        return nullptr;
    auto tyDecl = typeDeclarationFor(node);
    PSY_ASSERT_2(tyDecl->kind() == SymbolKind::StructDeclaration, return nullptr);
    return tyDecl->asStructDeclaration();
}